

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall
pbrt::BinaryWriter::write<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>
          (BinaryWriter *this,vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *t)

{
  pointer ptr;
  pointer pvVar1;
  long local_18;
  
  local_18 = ((long)(t->super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(t->super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  writeRaw(this,&local_18,8);
  ptr = (t->super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pvVar1 = (t->super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptr != pvVar1) {
    writeRaw(this,ptr,(long)pvVar1 - (long)ptr);
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      if (!t.empty())
        writeRaw(t.data(),t.size()*sizeof(T));
    }